

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

MemPage * btreePageFromDbPage(DbPage *pDbPage,Pgno pgno,BtShared *pBt)

{
  u8 uVar1;
  MemPage *pMVar2;
  u8 *puVar3;
  BtShared *in_RDX;
  Pgno in_ESI;
  DbPage *in_RDI;
  MemPage *pPage;
  
  pMVar2 = (MemPage *)sqlite3PagerGetExtra(in_RDI);
  if (in_ESI != pMVar2->pgno) {
    puVar3 = (u8 *)sqlite3PagerGetData(in_RDI);
    pMVar2->aData = puVar3;
    pMVar2->pDbPage = in_RDI;
    pMVar2->pBt = in_RDX;
    pMVar2->pgno = in_ESI;
    uVar1 = '\0';
    if (in_ESI == 1) {
      uVar1 = 'd';
    }
    pMVar2->hdrOffset = uVar1;
  }
  return pMVar2;
}

Assistant:

static MemPage *btreePageFromDbPage(DbPage *pDbPage, Pgno pgno, BtShared *pBt){
  MemPage *pPage = (MemPage*)sqlite3PagerGetExtra(pDbPage);
  if( pgno!=pPage->pgno ){
    pPage->aData = sqlite3PagerGetData(pDbPage);
    pPage->pDbPage = pDbPage;
    pPage->pBt = pBt;
    pPage->pgno = pgno;
    pPage->hdrOffset = pgno==1 ? 100 : 0;
  }
  assert( pPage->aData==sqlite3PagerGetData(pDbPage) );
  return pPage;
}